

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMurHash.c
# Opt level: O0

void PMurHash32_test(void *key,int len,uint32_t seed,void *out)

{
  uint32_t uVar1;
  uint32_t *in_RCX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  void *in_RDI;
  uchar *end;
  uchar *ptr;
  uint32_t carry;
  uint32_t h1;
  uint32_t local_20;
  uint32_t local_1c;
  uint32_t *local_18;
  uint32_t local_c;
  
  local_20 = 0;
  local_1c = in_EDX;
  local_18 = in_RCX;
  local_c = in_ESI;
  PMurHash32_Process(&local_1c,&local_20,in_RDI,in_ESI);
  uVar1 = PMurHash32_Result(local_1c,local_20,local_c);
  *local_18 = uVar1;
  return;
}

Assistant:

void PMurHash32_test(const void *key, int len, uint32_t seed, void *out)
{
  uint32_t h1=seed, carry=0;
  const uint8_t *ptr = (uint8_t*)key;
  const uint8_t *end = ptr + len;

#if 0 /* Exercise the progressive processing */
  while(ptr < end) {
    //const uint8_t *mid = ptr + rand()%(end-ptr)+1;
    const uint8_t *mid = ptr + (rand()&0xF);
    mid = mid<end?mid:end;
    PMurHash32_Process(&h1, &carry, ptr, mid-ptr);
    ptr = mid;
  }
#else
  PMurHash32_Process(&h1, &carry, ptr, (int)(end-ptr));
#endif
  h1 = PMurHash32_Result(h1, carry, len);
  *(uint32_t*)out = h1;
}